

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_registry.h
# Opt level: O2

Results * __thiscall
testinator::TestRegistry::RunSuite
          (Results *__return_storage_ptr__,TestRegistry *this,string *suiteName,RunParams *params,
          Outputter *outputter)

{
  mapped_type *__x;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>
  _Var1;
  _Alloc_hider outputter_00;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
  pVar2;
  TestMap localMap;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>
  local_88;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  pVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
          ::equal_range(&(this->m_testsBySuite)._M_t,suiteName);
  for (_Var1 = pVar2.first._M_node; _Var1._M_node != pVar2.second._M_node._M_node;
      _Var1._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var1._M_node)) {
    __x = std::
          map<testinator::Test_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<testinator::Test_*>,_std::allocator<std::pair<testinator::Test_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator[](&this->m_testNames,(key_type *)(_Var1._M_node + 2));
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_testinator::Test_*&,_true>
              (&local_88,__x,(Test **)(_Var1._M_node + 2));
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,testinator::Test*>,std::_Select1st<std::pair<std::__cxx11::string_const,testinator::Test*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,testinator::Test*>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,testinator::Test*>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,testinator::Test*>,std::_Select1st<std::pair<std::__cxx11::string_const,testinator::Test*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,testinator::Test*>>>
                *)&local_60,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
  }
  outputter_00._M_p = (pointer)outputter;
  if (outputter == (Outputter *)0x0) {
    std::make_unique<testinator::Outputter>();
    outputter_00._M_p = local_88.first._M_dataplus._M_p;
  }
  RunTests(__return_storage_ptr__,this,(TestMap *)&local_60,params,(Outputter *)outputter_00._M_p);
  if ((outputter == (Outputter *)0x0) &&
     ((Outputter *)local_88.first._M_dataplus._M_p != (Outputter *)0x0)) {
    (*(*(_func_int ***)local_88.first._M_dataplus._M_p)[8])();
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
  ::~_Rb_tree(&local_60);
  return __return_storage_ptr__;
}

Assistant:

Results RunSuite(const std::string& suiteName,
                     const RunParams& params = RunParams(),
                     const Outputter* outputter = nullptr)
    {
      TestMap localMap;
      auto range = m_testsBySuite.equal_range(suiteName);
      for (auto& i = range.first; i != range.second; ++i)
      {
        localMap.insert({m_testNames[i->second], i->second});
      }
      return RunTests(
          localMap,
          params,
          outputter != nullptr ? outputter : std::make_unique<Outputter>().get());
    }